

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_output.hpp
# Opt level: O2

void write_output<std::vector<unsigned_int,std::allocator<unsigned_int>>>
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *primes,endian output_endian,
               ostream *os)

{
  uint uVar1;
  uint *puVar2;
  uint *puVar3;
  uint *puVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38,
             (long)(primes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(primes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                   .super__Vector_impl_data._M_start);
  if (output_endian == native) {
    puVar2 = (primes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    puVar3 = (uint *)local_38._M_impl.super__Vector_impl_data._M_start;
    for (puVar4 = (primes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start; puVar4 != puVar2; puVar4 = puVar4 + 1) {
      *puVar3 = *puVar4;
      puVar3 = puVar3 + 1;
    }
  }
  else if (output_endian == big) {
    puVar2 = (primes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    puVar3 = (uint *)local_38._M_impl.super__Vector_impl_data._M_start;
    for (puVar4 = (primes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start; puVar4 != puVar2; puVar4 = puVar4 + 1) {
      uVar1 = *puVar4;
      *puVar3 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      puVar3 = puVar3 + 1;
    }
  }
  else if (output_endian == little) {
    puVar2 = (primes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    puVar3 = (uint *)local_38._M_impl.super__Vector_impl_data._M_start;
    for (puVar4 = (primes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start; puVar4 != puVar2; puVar4 = puVar4 + 1) {
      *puVar3 = *puVar4;
      puVar3 = puVar3 + 1;
    }
  }
  std::ostream::write((char *)os,(long)local_38._M_impl.super__Vector_impl_data._M_start);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
  return;
}

Assistant:

void write_output (ContainerType const & primes, endian output_endian, std::ostream & os) {

    using int_type = typename ContainerType::value_type;
    std::vector<std::uint8_t> bytes;
    bytes.resize (primes.size () * sizeof (int_type));
    auto ptr = bytes.data ();
    switch (output_endian) {
    case endian::big:
        for (auto v : primes) {
            ptr = write<int_type, endian::big> (v, ptr);
        }
        break;
    case endian::little:
        for (auto v : primes) {
            ptr = write<int_type, endian::little> (v, ptr);
        }
        break;
    case endian::native:
        for (auto v : primes) {
            ptr = write<int_type, endian::native> (v, ptr);
        }
        break;
    }
    os.write (reinterpret_cast<std::ofstream::char_type const *> (bytes.data ()),
              static_cast<std::streamsize> (sizeof (std::uint8_t) * bytes.size ()));
}